

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loopsubdiv.cpp
# Opt level: O0

Point3f pbrt::weightOneRing(SDVertex *vert,Float beta)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  Tuple3<pbrt::Point3,_float> TVar3;
  undefined1 auVar4 [12];
  undefined8 uVar5;
  undefined1 in_ZMM0 [64];
  undefined1 auVar6 [16];
  Point3<float> PVar7;
  Tuple3<pbrt::Point3,_float> TVar8;
  int i;
  InlinedVector<pbrt::Point3<float>,_16,_pstd::pmr::polymorphic_allocator<pbrt::Point3<float>_>_>
  pRing;
  int valence;
  Point3f p;
  size_type in_stack_fffffffffffffe28;
  undefined4 in_stack_fffffffffffffe30;
  float in_stack_fffffffffffffe34;
  SDVertex *in_stack_fffffffffffffe38;
  polymorphic_allocator<pbrt::Point3<float>_> *in_stack_fffffffffffffe40;
  Tuple3<pbrt::Point3,_float> *in_stack_fffffffffffffe48;
  undefined4 in_stack_fffffffffffffe50;
  float in_stack_fffffffffffffe54;
  float s;
  Tuple3<pbrt::Point3,_float> local_138;
  int local_12c;
  undefined8 local_128;
  float local_120;
  InlinedVector<pbrt::Point3<float>,_16,_pstd::pmr::polymorphic_allocator<pbrt::Point3<float>_>_>
  local_100;
  int local_20;
  float local_1c;
  undefined8 local_c;
  float local_4;
  
  local_1c = in_ZMM0._0_4_;
  local_20 = SDVertex::valence(in_stack_fffffffffffffe38);
  auVar4 = in_ZMM0._4_12_;
  pstd::pmr::polymorphic_allocator<pbrt::Point3<float>_>::polymorphic_allocator
            ((polymorphic_allocator<pbrt::Point3<float>_> *)
             CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30));
  InlinedVector<pbrt::Point3<float>,_16,_pstd::pmr::polymorphic_allocator<pbrt::Point3<float>_>_>::
  InlinedVector((InlinedVector<pbrt::Point3<float>,_16,_pstd::pmr::polymorphic_allocator<pbrt::Point3<float>_>_>
                 *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                (size_t)in_stack_fffffffffffffe48,in_stack_fffffffffffffe40);
  InlinedVector<pbrt::Point3<float>,_16,_pstd::pmr::polymorphic_allocator<pbrt::Point3<float>_>_>::
  data(&local_100);
  SDVertex::oneRing((SDVertex *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                    (Point3f *)in_stack_fffffffffffffe48);
  auVar6._0_4_ = (float)local_20;
  auVar6._4_12_ = auVar4;
  auVar1 = vfnmadd213ss_fma(ZEXT416((uint)local_1c),auVar6,SUB6416(ZEXT464(0x3f800000),0));
  uVar5 = auVar1._8_8_;
  PVar7 = operator*(in_stack_fffffffffffffe54,in_stack_fffffffffffffe48);
  TVar8.z = in_stack_fffffffffffffe34;
  TVar8._0_8_ = in_stack_fffffffffffffe38;
  local_120 = PVar7.super_Tuple3<pbrt::Point3,_float>.z;
  auVar1._8_8_ = uVar5;
  auVar1._0_8_ = PVar7.super_Tuple3<pbrt::Point3,_float>._0_8_;
  local_128 = vmovlpd_avx(auVar1);
  local_c = local_128;
  local_4 = local_120;
  for (local_12c = 0; local_12c < local_20; local_12c = local_12c + 1) {
    s = local_1c;
    InlinedVector<pbrt::Point3<float>,_16,_pstd::pmr::polymorphic_allocator<pbrt::Point3<float>_>_>
    ::operator[]((InlinedVector<pbrt::Point3<float>,_16,_pstd::pmr::polymorphic_allocator<pbrt::Point3<float>_>_>
                  *)CONCAT44(TVar8.z,in_stack_fffffffffffffe30),in_stack_fffffffffffffe28);
    uVar5 = 0;
    TVar8 = (Tuple3<pbrt::Point3,_float>)operator*(s,in_stack_fffffffffffffe48);
    local_138.z = TVar8.z;
    auVar2._8_8_ = uVar5;
    auVar2._0_8_ = TVar8._0_8_;
    local_138._0_8_ = vmovlpd_avx(auVar2);
    Tuple3<pbrt::Point3,float>::operator+=
              ((Tuple3<pbrt::Point3,float> *)&local_c,(Point3<float> *)&local_138);
  }
  InlinedVector<pbrt::Point3<float>,_16,_pstd::pmr::polymorphic_allocator<pbrt::Point3<float>_>_>::
  ~InlinedVector((InlinedVector<pbrt::Point3<float>,_16,_pstd::pmr::polymorphic_allocator<pbrt::Point3<float>_>_>
                  *)CONCAT44(TVar8.z,in_stack_fffffffffffffe30));
  TVar3.z = local_4;
  TVar3.x = (float)(undefined4)local_c;
  TVar3.y = (float)local_c._4_4_;
  return (Point3f)TVar3;
}

Assistant:

static Point3f weightOneRing(SDVertex *vert, Float beta) {
    // Put _vert_ one-ring in _pRing_
    int valence = vert->valence();
    InlinedVector<Point3f, 16> pRing(valence);

    vert->oneRing(pRing.data());
    Point3f p = (1 - valence * beta) * vert->p;
    for (int i = 0; i < valence; ++i)
        p += beta * pRing[i];
    return p;
}